

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O0

bool cmDefinitions::HasKey(string *key,StackIter begin,StackIter end)

{
  bool bVar1;
  PointerType pcVar2;
  cmLinkedTree<cmDefinitions> *pcVar3;
  string_view v;
  undefined1 auVar4 [16];
  _Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false> local_a8 [3];
  undefined1 local_90 [16];
  String local_80;
  _Node_iterator_base<std::pair<const_cm::String,_cmDefinitions::Def>,_false> local_60;
  cmLinkedTree<cmDefinitions> *local_58;
  PositionType local_50;
  undefined1 local_48 [8];
  StackIter it;
  string *key_local;
  StackIter end_local;
  StackIter begin_local;
  
  it.Tree = (cmLinkedTree<cmDefinitions> *)begin.Position;
  local_48 = (undefined1  [8])begin.Tree;
  pcVar3 = end.Tree;
  it.Position = (PositionType)key;
  while( true ) {
    local_58 = end.Tree;
    local_50 = end.Position;
    bVar1 = cmLinkedTree<cmDefinitions>::iterator::operator!=((iterator *)local_48,end);
    if (!bVar1) {
      return false;
    }
    pcVar2 = cmLinkedTree<cmDefinitions>::iterator::operator->((iterator *)local_48);
    auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)it.Position);
    v._M_len = auVar4._8_8_;
    v._M_str = (char *)pcVar3;
    local_90 = auVar4;
    ::cm::String::borrow(&local_80,auVar4._0_8_,v);
    local_60._M_cur =
         (__node_type *)
         std::
         unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
         ::find(&pcVar2->Map,&local_80);
    pcVar2 = cmLinkedTree<cmDefinitions>::iterator::operator->((iterator *)local_48);
    local_a8[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
         ::end(&pcVar2->Map);
    bVar1 = std::__detail::operator!=(&local_60,local_a8);
    ::cm::String::~String(&local_80);
    if (bVar1) break;
    cmLinkedTree<cmDefinitions>::iterator::operator++((iterator *)local_48);
  }
  return true;
}

Assistant:

bool cmDefinitions::HasKey(const std::string& key, StackIter begin,
                           StackIter end)
{
  for (StackIter it = begin; it != end; ++it) {
    if (it->Map.find(cm::String::borrow(key)) != it->Map.end()) {
      return true;
    }
  }
  return false;
}